

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trampoline.cpp
# Opt level: O2

Object * scm::trampoline::trampoline(Continuation *startFunction)

{
  Verbosity VVar1;
  Object *obj;
  double __x;
  double __x_00;
  double __x_01;
  string local_48;
  
  VVar1 = loguru::current_verbosity_cutoff();
  if ((-1 < VVar1) && (LOG_TRAMPOLINE_TRACE != '\0')) {
    loguru::log(__x);
  }
  pushFunc((Continuation *)0x11c013);
  while( true ) {
    VVar1 = loguru::current_verbosity_cutoff();
    if (startFunction == (Continuation *)0x0) break;
    if ((-1 < VVar1) && (LOG_TRAMPOLINE_TRACE != '\0')) {
      loguru::log(__x_00);
    }
    startFunction = (Continuation *)(*startFunction)();
  }
  if ((-1 < VVar1) && ((LOG_TRAMPOLINE_TRACE != '\0' || (LOG_STACK_TRACE != '\0')))) {
    toString_abi_cxx11_(&local_48,(scm *)lastReturnValue,obj);
    std::
    deque<std::variant<scm::Object_*,_scm::Environment_*,_void_*(*(*)())(),_unsigned_long,_int>,_std::allocator<std::variant<scm::Object_*,_scm::Environment_*,_void_*(*(*)())(),_unsigned_long,_int>_>_>
    ::size((deque<std::variant<scm::Object_*,_scm::Environment_*,_void_*(*(*)())(),_unsigned_long,_int>,_std::allocator<std::variant<scm::Object_*,_scm::Environment_*,_void_*(*(*)())(),_unsigned_long,_int>_>_>
            *)argumentStack);
    std::deque<void_*(*(*)())(),_std::allocator<void_*(*(*)())()>_>::size
              ((deque<void_*(*(*)())(),_std::allocator<void_*(*(*)())()>_> *)functionStack);
    loguru::log(__x_01);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return lastReturnValue;
}

Assistant:

Object* trampoline(Continuation* startFunction)
{
  DLOG_IF_F(INFO, LOG_TRAMPOLINE_TRACE, "in: trampoline");
  Continuation* nextFunction{startFunction};
  pushFunc(NULL);
  while (nextFunction != NULL) {
    DLOG_IF_F(INFO, LOG_TRAMPOLINE_TRACE, "in: trampoline loop");
    nextFunction = (Continuation*)(*nextFunction)();
  }
  DLOG_IF_F(INFO,
            LOG_TRAMPOLINE_TRACE || LOG_STACK_TRACE,
            "trampoline finished | returning %s | argStack: %d | funcStack: %d",
            toString(lastReturnValue).c_str(),
            static_cast<int>(argumentStack.size()),
            static_cast<int>(functionStack.size()));
  return lastReturnValue;
}